

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx2::BVHNIntersector1<8,_1,_false,_embree::avx2::SubGridIntersector1Moeller<8,_true>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ushort uVar9;
  ushort uVar10;
  RTCFilterFunctionN p_Var11;
  long lVar12;
  RTCRayQueryContext *pRVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  ulong uVar27;
  long lVar28;
  byte bVar29;
  int iVar30;
  uint uVar31;
  undefined4 uVar32;
  GridMesh *mesh;
  ulong uVar33;
  long lVar34;
  uint uVar35;
  long lVar36;
  ulong uVar37;
  uint uVar38;
  uint uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  bool bVar47;
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  float fVar52;
  float fVar53;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined8 uVar72;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  uint uVar76;
  undefined1 auVar75 [16];
  float fVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [64];
  uint uVar94;
  undefined1 auVar90 [16];
  uint uVar92;
  uint uVar93;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar91 [64];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [64];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [64];
  undefined1 auVar106 [32];
  undefined1 auVar107 [64];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [64];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  ulong local_1620;
  int local_15fc;
  Geometry *local_15f8;
  RTCIntersectArguments *local_15f0;
  ulong local_15e8;
  ulong local_15e0;
  ulong local_15d8;
  ulong local_15d0;
  ulong local_15c8;
  ulong local_15c0;
  ulong *local_15b8;
  ulong local_15b0;
  ulong local_15a8;
  ulong local_15a0;
  ulong local_1598;
  ulong local_1590;
  ulong local_1588;
  long local_1580;
  long local_1578;
  ulong local_1570;
  ulong local_1568;
  Scene *local_1560;
  long local_1558;
  undefined4 local_1550;
  undefined4 local_154c;
  undefined4 local_1548;
  float local_1544;
  float local_1540;
  uint local_153c;
  uint local_1538;
  uint local_1534;
  uint local_1530;
  RTCFilterFunctionNArguments local_1520;
  undefined1 local_14f0 [16];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [8];
  float fStack_1498;
  float fStack_1494;
  float fStack_1490;
  float fStack_148c;
  float fStack_1488;
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_12e0 [32];
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  ulong local_1200;
  ulong local_11f8 [569];
  
  local_1200 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_1200 != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      local_15b8 = local_11f8;
      auVar14 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar2 = (ray->dir).field_0;
      auVar75._8_4_ = 0x7fffffff;
      auVar75._0_8_ = 0x7fffffff7fffffff;
      auVar75._12_4_ = 0x7fffffff;
      auVar75 = vandps_avx((undefined1  [16])aVar2,auVar75);
      auVar78._8_4_ = 0x219392ef;
      auVar78._0_8_ = 0x219392ef219392ef;
      auVar78._12_4_ = 0x219392ef;
      auVar75 = vcmpps_avx(auVar75,auVar78,1);
      auVar75 = vblendvps_avx((undefined1  [16])aVar2,auVar78,auVar75);
      auVar78 = vrcpps_avx(auVar75);
      auVar79._8_4_ = 0x3f800000;
      auVar79._0_8_ = 0x3f8000003f800000;
      auVar79._12_4_ = 0x3f800000;
      auVar75 = vfnmadd231ps_fma(auVar79,auVar78,auVar75);
      auVar17 = vfmadd132ps_fma(auVar75,auVar78,auVar78);
      fVar77 = auVar17._0_4_;
      auVar114 = ZEXT3264(CONCAT428(fVar77,CONCAT424(fVar77,CONCAT420(fVar77,CONCAT416(fVar77,
                                                  CONCAT412(fVar77,CONCAT48(fVar77,CONCAT44(fVar77,
                                                  fVar77))))))));
      auVar75 = vmovshdup_avx(auVar17);
      uVar72 = auVar75._0_8_;
      local_13a0._8_8_ = uVar72;
      local_13a0._0_8_ = uVar72;
      local_13a0._16_8_ = uVar72;
      local_13a0._24_8_ = uVar72;
      auVar89 = ZEXT3264(local_13a0);
      auVar79 = vshufpd_avx(auVar17,auVar17,1);
      auVar78 = vshufps_avx(auVar17,auVar17,0xaa);
      auVar80._0_4_ = fVar77 * (ray->org).field_0.m128[0];
      auVar80._4_4_ = auVar17._4_4_ * (ray->org).field_0.m128[1];
      auVar80._8_4_ = auVar17._8_4_ * (ray->org).field_0.m128[2];
      auVar80._12_4_ = auVar17._12_4_ * (ray->org).field_0.m128[3];
      uVar72 = auVar78._0_8_;
      local_13c0._8_8_ = uVar72;
      local_13c0._0_8_ = uVar72;
      local_13c0._16_8_ = uVar72;
      local_13c0._24_8_ = uVar72;
      auVar91 = ZEXT3264(local_13c0);
      auVar78 = vmovshdup_avx(auVar80);
      auVar17 = vshufps_avx(auVar80,auVar80,0xaa);
      local_15c0 = (ulong)(fVar77 < 0.0) << 5;
      local_15c8 = (ulong)(auVar75._0_4_ < 0.0) << 5 | 0x40;
      local_15d0 = (ulong)(auVar79._0_4_ < 0.0) << 5 | 0x80;
      local_15d8 = local_15c0 ^ 0x20;
      local_15e0 = local_15c8 ^ 0x20;
      local_15e8 = local_15d0 ^ 0x20;
      uVar46 = CONCAT44(auVar80._0_4_,auVar80._0_4_);
      local_13e0._0_8_ = uVar46 ^ 0x8000000080000000;
      local_13e0._8_4_ = -auVar80._0_4_;
      local_13e0._12_4_ = -auVar80._0_4_;
      local_13e0._16_4_ = -auVar80._0_4_;
      local_13e0._20_4_ = -auVar80._0_4_;
      local_13e0._24_4_ = -auVar80._0_4_;
      local_13e0._28_4_ = -auVar80._0_4_;
      auVar101 = ZEXT3264(local_13e0);
      uVar31 = auVar78._0_4_;
      uVar76 = auVar78._4_4_;
      local_1400._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
      local_1400._8_4_ = uVar31 ^ 0x80000000;
      local_1400._12_4_ = uVar76 ^ 0x80000000;
      local_1400._16_4_ = uVar31 ^ 0x80000000;
      local_1400._20_4_ = uVar76 ^ 0x80000000;
      local_1400._24_4_ = uVar31 ^ 0x80000000;
      local_1400._28_4_ = uVar76 ^ 0x80000000;
      auVar105 = ZEXT3264(local_1400);
      uVar31 = auVar17._0_4_;
      uVar76 = auVar17._4_4_;
      local_1420._0_8_ = auVar17._0_8_ ^ 0x8000000080000000;
      local_1420._8_4_ = uVar31 ^ 0x80000000;
      local_1420._12_4_ = uVar76 ^ 0x80000000;
      local_1420._16_4_ = uVar31 ^ 0x80000000;
      local_1420._20_4_ = uVar76 ^ 0x80000000;
      local_1420._24_4_ = uVar31 ^ 0x80000000;
      local_1420._28_4_ = uVar76 ^ 0x80000000;
      auVar107 = ZEXT3264(local_1420);
      uVar32 = auVar14._0_4_;
      local_1440._4_4_ = uVar32;
      local_1440._0_4_ = uVar32;
      local_1440._8_4_ = uVar32;
      local_1440._12_4_ = uVar32;
      local_1440._16_4_ = uVar32;
      local_1440._20_4_ = uVar32;
      local_1440._24_4_ = uVar32;
      local_1440._28_4_ = uVar32;
      auVar110 = ZEXT3264(local_1440);
      local_1460._4_4_ = fVar1;
      local_1460._0_4_ = fVar1;
      local_1460._8_4_ = fVar1;
      local_1460._12_4_ = fVar1;
      local_1460._16_4_ = fVar1;
      local_1460._20_4_ = fVar1;
      local_1460._24_4_ = fVar1;
      local_1460._28_4_ = fVar1;
      auVar113 = ZEXT3264(local_1460);
      local_1588 = (ulong)(((uint)(fVar77 < 0.0) << 5) >> 2);
      local_1590 = local_15d8 >> 2;
      local_1598 = local_15c8 >> 2;
      local_15a0 = local_15e0 >> 2;
      local_14e0._16_16_ = mm_lookupmask_ps._240_16_;
      local_14e0._0_16_ = mm_lookupmask_ps._240_16_;
      local_15a8 = local_15d0 >> 2;
      local_1480 = vperm2f128_avx(local_14e0,mm_lookupmask_ps._0_32_,2);
      local_15b0 = local_15e8 >> 2;
      auVar48._8_4_ = 0xbf800000;
      auVar48._0_8_ = 0xbf800000bf800000;
      auVar48._12_4_ = 0xbf800000;
      auVar48._16_4_ = 0xbf800000;
      auVar48._20_4_ = 0xbf800000;
      auVar48._24_4_ = 0xbf800000;
      auVar48._28_4_ = 0xbf800000;
      auVar67._8_4_ = 0x3f800000;
      auVar67._0_8_ = 0x3f8000003f800000;
      auVar67._12_4_ = 0x3f800000;
      auVar67._16_4_ = 0x3f800000;
      auVar67._20_4_ = 0x3f800000;
      auVar67._24_4_ = 0x3f800000;
      auVar67._28_4_ = 0x3f800000;
      _local_14a0 = vblendvps_avx(auVar67,auVar48,local_1480);
      uVar46 = local_15d8;
      uVar37 = local_15c0;
      uVar40 = local_15c8;
      uVar41 = local_15d0;
      uVar42 = local_15e8;
      uVar45 = local_15e0;
LAB_004d6732:
      do {
        uVar44 = local_15b8[-1];
        local_15b8 = local_15b8 + -1;
        while ((uVar44 & 8) == 0) {
          auVar75 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar44 + 0x40 + uVar37),auVar101._0_32_,
                                    auVar114._0_32_);
          auVar14 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar44 + 0x40 + uVar40),auVar105._0_32_,
                                    auVar89._0_32_);
          auVar48 = vpmaxsd_avx2(ZEXT1632(auVar75),ZEXT1632(auVar14));
          auVar75 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar44 + 0x40 + uVar41),auVar107._0_32_,
                                    auVar91._0_32_);
          auVar14 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar44 + 0x40 + uVar46),auVar101._0_32_,
                                    auVar114._0_32_);
          auVar78 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar44 + 0x40 + uVar45),auVar105._0_32_,
                                    auVar89._0_32_);
          auVar54 = vpminsd_avx2(ZEXT1632(auVar14),ZEXT1632(auVar78));
          auVar14 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar44 + 0x40 + uVar42),auVar107._0_32_,
                                    auVar91._0_32_);
          auVar67 = vpmaxsd_avx2(ZEXT1632(auVar75),auVar110._0_32_);
          auVar48 = vpmaxsd_avx2(auVar48,auVar67);
          auVar67 = vpminsd_avx2(ZEXT1632(auVar14),auVar113._0_32_);
          auVar67 = vpminsd_avx2(auVar54,auVar67);
          auVar48 = vpcmpgtd_avx2(auVar48,auVar67);
          iVar30 = vmovmskps_avx(auVar48);
          if (iVar30 == 0xff) {
            if (local_15b8 == &local_1200) {
              return;
            }
            goto LAB_004d6732;
          }
          bVar29 = ~(byte)iVar30;
          uVar27 = uVar44 & 0xfffffffffffffff0;
          lVar34 = 0;
          for (uVar44 = (ulong)bVar29; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000)
          {
            lVar34 = lVar34 + 1;
          }
          uVar44 = *(ulong *)(uVar27 + lVar34 * 8);
          uVar31 = bVar29 - 1 & (uint)bVar29;
          uVar33 = (ulong)uVar31;
          if (uVar31 != 0) {
            *local_15b8 = uVar44;
            lVar34 = 0;
            for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
              lVar34 = lVar34 + 1;
            }
            uVar31 = uVar31 - 1 & uVar31;
            uVar33 = (ulong)uVar31;
            bVar47 = uVar31 == 0;
            while( true ) {
              local_15b8 = local_15b8 + 1;
              uVar44 = *(ulong *)(uVar27 + lVar34 * 8);
              if (bVar47) break;
              *local_15b8 = uVar44;
              lVar34 = 0;
              for (uVar44 = uVar33; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
                lVar34 = lVar34 + 1;
              }
              uVar33 = uVar33 - 1 & uVar33;
              bVar47 = uVar33 == 0;
            }
          }
        }
        local_1580 = (ulong)((uint)uVar44 & 0xf) - 8;
        if (local_1580 != 0) {
          uVar44 = uVar44 & 0xfffffffffffffff0;
          local_1578 = 0;
          do {
            lVar34 = local_1578 * 0x90;
            local_1558 = uVar44 + lVar34;
            auVar14._8_8_ = 0;
            auVar14._0_8_ = *(ulong *)(uVar44 + 0x40 + lVar34);
            auVar14 = vpmovzxbw_avx(auVar14);
            auVar17._8_8_ = 0;
            auVar17._0_8_ = *(ulong *)(uVar44 + 0x48 + lVar34);
            auVar75 = vpmovzxbw_avx(auVar17);
            auVar75 = vpminuw_avx(auVar14,auVar75);
            auVar75 = vpcmpeqw_avx(auVar14,auVar75);
            auVar75 = vpacksswb_avx(auVar75,auVar75);
            uVar32 = *(undefined4 *)(uVar44 + 0x70 + lVar34);
            auVar54._4_4_ = uVar32;
            auVar54._0_4_ = uVar32;
            auVar54._8_4_ = uVar32;
            auVar54._12_4_ = uVar32;
            auVar54._16_4_ = uVar32;
            auVar54._20_4_ = uVar32;
            auVar54._24_4_ = uVar32;
            auVar54._28_4_ = uVar32;
            uVar32 = *(undefined4 *)(uVar44 + 0x7c + lVar34);
            auVar68._4_4_ = uVar32;
            auVar68._0_4_ = uVar32;
            auVar68._8_4_ = uVar32;
            auVar68._12_4_ = uVar32;
            auVar68._16_4_ = uVar32;
            auVar68._20_4_ = uVar32;
            auVar68._24_4_ = uVar32;
            auVar68._28_4_ = uVar32;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = *(ulong *)(local_1588 + 0x40 + local_1558);
            auVar48 = vpmovzxbd_avx2(auVar3);
            auVar48 = vcvtdq2ps_avx(auVar48);
            auVar14 = vfmadd213ps_fma(auVar48,auVar68,auVar54);
            auVar4._8_8_ = 0;
            auVar4._0_8_ = *(ulong *)(local_1590 + 0x40 + local_1558);
            auVar48 = vpmovzxbd_avx2(auVar4);
            auVar48 = vcvtdq2ps_avx(auVar48);
            auVar78 = vfmadd213ps_fma(auVar48,auVar68,auVar54);
            uVar32 = *(undefined4 *)(uVar44 + 0x74 + lVar34);
            auVar55._4_4_ = uVar32;
            auVar55._0_4_ = uVar32;
            auVar55._8_4_ = uVar32;
            auVar55._12_4_ = uVar32;
            auVar55._16_4_ = uVar32;
            auVar55._20_4_ = uVar32;
            auVar55._24_4_ = uVar32;
            auVar55._28_4_ = uVar32;
            uVar32 = *(undefined4 *)(uVar44 + 0x80 + lVar34);
            auVar69._4_4_ = uVar32;
            auVar69._0_4_ = uVar32;
            auVar69._8_4_ = uVar32;
            auVar69._12_4_ = uVar32;
            auVar69._16_4_ = uVar32;
            auVar69._20_4_ = uVar32;
            auVar69._24_4_ = uVar32;
            auVar69._28_4_ = uVar32;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = *(ulong *)(local_1598 + 0x40 + local_1558);
            auVar48 = vpmovzxbd_avx2(auVar5);
            auVar48 = vcvtdq2ps_avx(auVar48);
            auVar79 = vfmadd213ps_fma(auVar48,auVar69,auVar55);
            auVar6._8_8_ = 0;
            auVar6._0_8_ = *(ulong *)(local_15a0 + 0x40 + local_1558);
            auVar48 = vpmovzxbd_avx2(auVar6);
            auVar48 = vcvtdq2ps_avx(auVar48);
            auVar17 = vfmadd213ps_fma(auVar48,auVar69,auVar55);
            uVar32 = *(undefined4 *)(uVar44 + 0x78 + lVar34);
            auVar56._4_4_ = uVar32;
            auVar56._0_4_ = uVar32;
            auVar56._8_4_ = uVar32;
            auVar56._12_4_ = uVar32;
            auVar56._16_4_ = uVar32;
            auVar56._20_4_ = uVar32;
            auVar56._24_4_ = uVar32;
            auVar56._28_4_ = uVar32;
            uVar32 = *(undefined4 *)(uVar44 + 0x84 + lVar34);
            auVar70._4_4_ = uVar32;
            auVar70._0_4_ = uVar32;
            auVar70._8_4_ = uVar32;
            auVar70._12_4_ = uVar32;
            auVar70._16_4_ = uVar32;
            auVar70._20_4_ = uVar32;
            auVar70._24_4_ = uVar32;
            auVar70._28_4_ = uVar32;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = *(ulong *)(local_15a8 + 0x40 + local_1558);
            auVar48 = vpmovzxbd_avx2(auVar7);
            auVar48 = vcvtdq2ps_avx(auVar48);
            auVar80 = vfmadd213ps_fma(auVar48,auVar70,auVar56);
            auVar8._8_8_ = 0;
            auVar8._0_8_ = *(ulong *)(local_15b0 + 0x40 + local_1558);
            auVar48 = vpmovzxbd_avx2(auVar8);
            auVar48 = vcvtdq2ps_avx(auVar48);
            auVar3 = vfmadd213ps_fma(auVar48,auVar70,auVar56);
            auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar114._0_32_,auVar101._0_32_);
            auVar79 = vfmadd213ps_fma(ZEXT1632(auVar79),auVar89._0_32_,auVar105._0_32_);
            auVar48 = vpmaxsd_avx2(ZEXT1632(auVar14),ZEXT1632(auVar79));
            auVar14 = vfmadd213ps_fma(ZEXT1632(auVar80),auVar91._0_32_,auVar107._0_32_);
            auVar78 = vfmadd213ps_fma(ZEXT1632(auVar78),auVar114._0_32_,auVar101._0_32_);
            auVar79 = vfmadd213ps_fma(ZEXT1632(auVar17),auVar89._0_32_,auVar105._0_32_);
            auVar54 = vpminsd_avx2(ZEXT1632(auVar78),ZEXT1632(auVar79));
            auVar78 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar91._0_32_,auVar107._0_32_);
            auVar67 = vpmaxsd_avx2(ZEXT1632(auVar14),auVar110._0_32_);
            auVar48 = vpmaxsd_avx2(auVar48,auVar67);
            auVar67 = vpminsd_avx2(ZEXT1632(auVar78),auVar113._0_32_);
            auVar67 = vpminsd_avx2(auVar54,auVar67);
            auVar48 = vpcmpgtd_avx2(auVar48,auVar67);
            uVar32 = vmovmskps_avx(auVar48);
            bVar29 = ~(byte)uVar32 &
                     (SUB161(auVar75 >> 7,0) & 1 | (SUB161(auVar75 >> 0xf,0) & 1) << 1 |
                      (SUB161(auVar75 >> 0x17,0) & 1) << 2 | (SUB161(auVar75 >> 0x1f,0) & 1) << 3 |
                      (SUB161(auVar75 >> 0x27,0) & 1) << 4 | (SUB161(auVar75 >> 0x2f,0) & 1) << 5 |
                      (SUB161(auVar75 >> 0x37,0) & 1) << 6 | SUB161(auVar75 >> 0x3f,0) << 7);
            if (bVar29 != 0) {
              uVar46 = (ulong)bVar29;
              local_1560 = context->scene;
              do {
                lVar34 = 0;
                for (uVar37 = uVar46; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000)
                {
                  lVar34 = lVar34 + 1;
                }
                uVar9 = *(ushort *)(local_1558 + lVar34 * 8);
                uVar10 = *(ushort *)(local_1558 + 2 + lVar34 * 8);
                uVar31 = *(uint *)(local_1558 + 0x88);
                uVar76 = *(uint *)(local_1558 + 4 + lVar34 * 8);
                local_1568 = (ulong)uVar31;
                local_15f8 = (local_1560->geometries).items[uVar31].ptr;
                lVar34 = *(long *)&local_15f8->field_0x58;
                local_1570 = (ulong)uVar76;
                lVar28 = local_15f8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                         _M_i * (ulong)uVar76;
                uVar38 = uVar9 & 0x7fff;
                uVar39 = uVar10 & 0x7fff;
                uVar35 = *(uint *)(lVar34 + 4 + lVar28);
                uVar41 = (ulong)uVar35;
                uVar40 = (ulong)(uVar35 * uVar39 + *(int *)(lVar34 + lVar28) + uVar38);
                p_Var11 = local_15f8[1].intersectionFilterN;
                lVar12 = *(long *)&local_15f8[1].time_range.upper;
                auVar75 = *(undefined1 (*) [16])(lVar12 + (uVar40 + 1) * (long)p_Var11);
                auVar14 = *(undefined1 (*) [16])(lVar12 + (uVar40 + uVar41) * (long)p_Var11);
                lVar43 = uVar40 + uVar41 + 1;
                auVar78 = *(undefined1 (*) [16])(lVar12 + lVar43 * (long)p_Var11);
                auVar79 = *(undefined1 (*) [16])
                           (lVar12 + (uVar40 + (-1 < (short)uVar9) + 1) * (long)p_Var11);
                lVar36 = (ulong)(-1 < (short)uVar9) + lVar43;
                uVar37 = 0;
                if (-1 < (short)uVar10) {
                  uVar37 = uVar41;
                }
                auVar17 = *(undefined1 (*) [16])(lVar12 + lVar36 * (long)p_Var11);
                auVar80 = *(undefined1 (*) [16])
                           (lVar12 + (uVar40 + uVar41 + uVar37) * (long)p_Var11);
                auVar3 = *(undefined1 (*) [16])(lVar12 + (lVar43 + uVar37) * (long)p_Var11);
                auVar87._16_16_ = *(undefined1 (*) [16])(lVar12 + (uVar37 + lVar36) * (long)p_Var11)
                ;
                auVar87._0_16_ = auVar78;
                auVar5 = vunpcklps_avx(auVar75,auVar17);
                auVar4 = vunpckhps_avx(auVar75,auVar17);
                auVar6 = vunpcklps_avx(auVar79,auVar78);
                auVar79 = vunpckhps_avx(auVar79,auVar78);
                auVar7 = vunpcklps_avx(auVar4,auVar79);
                auVar8 = vunpcklps_avx(auVar5,auVar6);
                auVar79 = vunpckhps_avx(auVar5,auVar6);
                auVar5 = vunpcklps_avx(auVar14,auVar3);
                auVar4 = vunpckhps_avx(auVar14,auVar3);
                auVar6 = vunpcklps_avx(auVar78,auVar80);
                auVar80 = vunpckhps_avx(auVar78,auVar80);
                auVar4 = vunpcklps_avx(auVar4,auVar80);
                auVar81 = vunpcklps_avx(auVar5,auVar6);
                auVar80 = vunpckhps_avx(auVar5,auVar6);
                auVar86._16_16_ = auVar3;
                auVar86._0_16_ = auVar14;
                auVar57._16_16_ = auVar17;
                auVar57._0_16_ = auVar75;
                auVar48 = vunpcklps_avx(auVar57,auVar86);
                auVar49._16_16_ = auVar78;
                auVar49._0_16_ = *(undefined1 (*) [16])(lVar12 + (long)p_Var11 * uVar40);
                auVar67 = vunpcklps_avx(auVar49,auVar87);
                auVar15 = vunpcklps_avx(auVar67,auVar48);
                auVar70 = vunpckhps_avx(auVar67,auVar48);
                auVar48 = vunpckhps_avx(auVar57,auVar86);
                auVar67 = vunpckhps_avx(auVar49,auVar87);
                auVar16 = vunpcklps_avx(auVar67,auVar48);
                auVar50._16_16_ = auVar8;
                auVar50._0_16_ = auVar8;
                auVar73._16_16_ = auVar79;
                auVar73._0_16_ = auVar79;
                auVar82._16_16_ = auVar7;
                auVar82._0_16_ = auVar7;
                auVar98._16_16_ = auVar81;
                auVar98._0_16_ = auVar81;
                auVar102._16_16_ = auVar80;
                auVar102._0_16_ = auVar80;
                auVar106._16_16_ = auVar4;
                auVar106._0_16_ = auVar4;
                auVar67 = vsubps_avx(auVar15,auVar50);
                auVar48 = vsubps_avx(auVar70,auVar73);
                auVar54 = vsubps_avx(auVar16,auVar82);
                auVar55 = vsubps_avx(auVar98,auVar15);
                auVar56 = vsubps_avx(auVar102,auVar70);
                auVar68 = vsubps_avx(auVar106,auVar16);
                auVar18._4_4_ = auVar48._4_4_ * auVar68._4_4_;
                auVar18._0_4_ = auVar48._0_4_ * auVar68._0_4_;
                auVar18._8_4_ = auVar48._8_4_ * auVar68._8_4_;
                auVar18._12_4_ = auVar48._12_4_ * auVar68._12_4_;
                auVar18._16_4_ = auVar48._16_4_ * auVar68._16_4_;
                auVar18._20_4_ = auVar48._20_4_ * auVar68._20_4_;
                auVar18._24_4_ = auVar48._24_4_ * auVar68._24_4_;
                auVar18._28_4_ = auVar8._12_4_;
                uVar32 = *(undefined4 *)&(ray->org).field_0;
                auVar74._4_4_ = uVar32;
                auVar74._0_4_ = uVar32;
                auVar74._8_4_ = uVar32;
                auVar74._12_4_ = uVar32;
                auVar74._16_4_ = uVar32;
                auVar74._20_4_ = uVar32;
                auVar74._24_4_ = uVar32;
                auVar74._28_4_ = uVar32;
                uVar32 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
                auVar108._4_4_ = uVar32;
                auVar108._0_4_ = uVar32;
                auVar108._8_4_ = uVar32;
                auVar108._12_4_ = uVar32;
                auVar108._16_4_ = uVar32;
                auVar108._20_4_ = uVar32;
                auVar108._24_4_ = uVar32;
                auVar108._28_4_ = uVar32;
                uVar32 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
                auVar111._4_4_ = uVar32;
                auVar111._0_4_ = uVar32;
                auVar111._8_4_ = uVar32;
                auVar111._12_4_ = uVar32;
                auVar111._16_4_ = uVar32;
                auVar111._20_4_ = uVar32;
                auVar111._24_4_ = uVar32;
                auVar111._28_4_ = uVar32;
                fVar1 = (ray->dir).field_0.m128[0];
                auVar99._4_4_ = fVar1;
                auVar99._0_4_ = fVar1;
                auVar99._8_4_ = fVar1;
                auVar99._12_4_ = fVar1;
                auVar99._16_4_ = fVar1;
                auVar99._20_4_ = fVar1;
                auVar99._24_4_ = fVar1;
                auVar99._28_4_ = fVar1;
                auVar79 = vfmsub231ps_fma(auVar18,auVar56,auVar54);
                fVar77 = (ray->dir).field_0.m128[1];
                auVar103._4_4_ = fVar77;
                auVar103._0_4_ = fVar77;
                auVar103._8_4_ = fVar77;
                auVar103._12_4_ = fVar77;
                auVar103._16_4_ = fVar77;
                auVar103._20_4_ = fVar77;
                auVar103._24_4_ = fVar77;
                auVar103._28_4_ = fVar77;
                auVar69 = vsubps_avx(auVar15,auVar74);
                auVar19._4_4_ = auVar54._4_4_ * auVar55._4_4_;
                auVar19._0_4_ = auVar54._0_4_ * auVar55._0_4_;
                auVar19._8_4_ = auVar54._8_4_ * auVar55._8_4_;
                auVar19._12_4_ = auVar54._12_4_ * auVar55._12_4_;
                auVar19._16_4_ = auVar54._16_4_ * auVar55._16_4_;
                auVar19._20_4_ = auVar54._20_4_ * auVar55._20_4_;
                auVar19._24_4_ = auVar54._24_4_ * auVar55._24_4_;
                auVar19._28_4_ = auVar15._28_4_;
                auVar70 = vsubps_avx(auVar70,auVar108);
                fVar95 = (ray->dir).field_0.m128[2];
                auVar109._4_4_ = fVar95;
                auVar109._0_4_ = fVar95;
                auVar109._8_4_ = fVar95;
                auVar109._12_4_ = fVar95;
                auVar109._16_4_ = fVar95;
                auVar109._20_4_ = fVar95;
                auVar109._24_4_ = fVar95;
                auVar109._28_4_ = fVar95;
                auVar17 = vfmsub231ps_fma(auVar19,auVar68,auVar67);
                auVar15 = vsubps_avx(auVar16,auVar111);
                auVar16._4_4_ = fVar1 * auVar70._4_4_;
                auVar16._0_4_ = fVar1 * auVar70._0_4_;
                auVar16._8_4_ = fVar1 * auVar70._8_4_;
                auVar16._12_4_ = fVar1 * auVar70._12_4_;
                auVar16._16_4_ = fVar1 * auVar70._16_4_;
                auVar16._20_4_ = fVar1 * auVar70._20_4_;
                auVar16._24_4_ = fVar1 * auVar70._24_4_;
                auVar16._28_4_ = uVar32;
                auVar75 = vfmsub231ps_fma(auVar16,auVar69,auVar103);
                auVar20._4_4_ = auVar68._4_4_ * auVar75._4_4_;
                auVar20._0_4_ = auVar68._0_4_ * auVar75._0_4_;
                auVar20._8_4_ = auVar68._8_4_ * auVar75._8_4_;
                auVar20._12_4_ = auVar68._12_4_ * auVar75._12_4_;
                auVar20._16_4_ = auVar68._16_4_ * 0.0;
                auVar20._20_4_ = auVar68._20_4_ * 0.0;
                auVar20._24_4_ = auVar68._24_4_ * 0.0;
                auVar20._28_4_ = auVar68._28_4_;
                auVar112._0_4_ = auVar54._0_4_ * auVar75._0_4_;
                auVar112._4_4_ = auVar54._4_4_ * auVar75._4_4_;
                auVar112._8_4_ = auVar54._8_4_ * auVar75._8_4_;
                auVar112._12_4_ = auVar54._12_4_ * auVar75._12_4_;
                auVar112._16_4_ = auVar54._16_4_ * 0.0;
                auVar112._20_4_ = auVar54._20_4_ * 0.0;
                auVar112._24_4_ = auVar54._24_4_ * 0.0;
                auVar112._28_4_ = 0;
                auVar21._4_4_ = fVar95 * auVar69._4_4_;
                auVar21._0_4_ = fVar95 * auVar69._0_4_;
                auVar21._8_4_ = fVar95 * auVar69._8_4_;
                auVar21._12_4_ = fVar95 * auVar69._12_4_;
                auVar21._16_4_ = fVar95 * auVar69._16_4_;
                auVar21._20_4_ = fVar95 * auVar69._20_4_;
                auVar21._24_4_ = fVar95 * auVar69._24_4_;
                auVar21._28_4_ = auVar54._28_4_;
                auVar14 = vfmsub231ps_fma(auVar21,auVar15,auVar99);
                auVar75 = vfmadd231ps_fma(auVar20,ZEXT1632(auVar14),auVar56);
                auVar14 = vfmadd231ps_fma(auVar112,auVar48,ZEXT1632(auVar14));
                auVar22._4_4_ = auVar67._4_4_ * auVar56._4_4_;
                auVar22._0_4_ = auVar67._0_4_ * auVar56._0_4_;
                auVar22._8_4_ = auVar67._8_4_ * auVar56._8_4_;
                auVar22._12_4_ = auVar67._12_4_ * auVar56._12_4_;
                auVar22._16_4_ = auVar67._16_4_ * auVar56._16_4_;
                auVar22._20_4_ = auVar67._20_4_ * auVar56._20_4_;
                auVar22._24_4_ = auVar67._24_4_ * auVar56._24_4_;
                auVar22._28_4_ = auVar56._28_4_;
                auVar78 = vfmsub231ps_fma(auVar22,auVar55,auVar48);
                auVar23._4_4_ = fVar77 * auVar15._4_4_;
                auVar23._0_4_ = fVar77 * auVar15._0_4_;
                auVar23._8_4_ = fVar77 * auVar15._8_4_;
                auVar23._12_4_ = fVar77 * auVar15._12_4_;
                auVar23._16_4_ = fVar77 * auVar15._16_4_;
                auVar23._20_4_ = fVar77 * auVar15._20_4_;
                auVar23._24_4_ = fVar77 * auVar15._24_4_;
                auVar23._28_4_ = auVar48._28_4_;
                auVar80 = vfmsub231ps_fma(auVar23,auVar70,auVar109);
                fVar1 = auVar78._0_4_;
                fVar77 = auVar78._4_4_;
                auVar24._4_4_ = fVar95 * fVar77;
                auVar24._0_4_ = fVar95 * fVar1;
                fVar53 = auVar78._8_4_;
                auVar24._8_4_ = fVar95 * fVar53;
                fVar59 = auVar78._12_4_;
                auVar24._12_4_ = fVar95 * fVar59;
                auVar24._16_4_ = fVar95 * 0.0;
                auVar24._20_4_ = fVar95 * 0.0;
                auVar24._24_4_ = fVar95 * 0.0;
                auVar24._28_4_ = fVar95;
                auVar78 = vfmadd231ps_fma(auVar24,ZEXT1632(auVar17),auVar103);
                auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),ZEXT1632(auVar79),auVar99);
                auVar100._8_4_ = 0x7fffffff;
                auVar100._0_8_ = 0x7fffffff7fffffff;
                auVar100._12_4_ = 0x7fffffff;
                auVar100._16_4_ = 0x7fffffff;
                auVar100._20_4_ = 0x7fffffff;
                auVar100._24_4_ = 0x7fffffff;
                auVar100._28_4_ = 0x7fffffff;
                auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),ZEXT1632(auVar80),auVar55);
                auVar83._8_8_ = 0x8000000080000000;
                auVar83._0_8_ = 0x8000000080000000;
                auVar83._16_8_ = 0x8000000080000000;
                auVar83._24_8_ = 0x8000000080000000;
                auVar48 = vandps_avx(ZEXT1632(auVar78),auVar83);
                uVar35 = auVar48._0_4_;
                auVar84._0_4_ = (float)(uVar35 ^ auVar75._0_4_);
                uVar92 = auVar48._4_4_;
                auVar84._4_4_ = (float)(uVar92 ^ auVar75._4_4_);
                uVar93 = auVar48._8_4_;
                auVar84._8_4_ = (float)(uVar93 ^ auVar75._8_4_);
                uVar94 = auVar48._12_4_;
                auVar84._12_4_ = (float)(uVar94 ^ auVar75._12_4_);
                fVar95 = auVar48._16_4_;
                auVar84._16_4_ = fVar95;
                fVar96 = auVar48._20_4_;
                auVar84._20_4_ = fVar96;
                fVar97 = auVar48._24_4_;
                auVar84._24_4_ = fVar97;
                fStack_1264 = auVar48._28_4_;
                auVar84._28_4_ = fStack_1264;
                auVar75 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar67,ZEXT1632(auVar80));
                auVar88._0_4_ = (float)(uVar35 ^ auVar75._0_4_);
                auVar88._4_4_ = (float)(uVar92 ^ auVar75._4_4_);
                auVar88._8_4_ = (float)(uVar93 ^ auVar75._8_4_);
                auVar88._12_4_ = (float)(uVar94 ^ auVar75._12_4_);
                auVar88._16_4_ = fVar95;
                auVar88._20_4_ = fVar96;
                auVar88._24_4_ = fVar97;
                auVar88._28_4_ = fStack_1264;
                auVar48 = vcmpps_avx(auVar84,ZEXT832(0) << 0x20,5);
                auVar67 = vcmpps_avx(auVar88,ZEXT832(0) << 0x20,5);
                auVar48 = vandps_avx(auVar67,auVar48);
                local_1320 = vandps_avx(ZEXT1632(auVar78),auVar100);
                auVar67 = vcmpps_avx(ZEXT1632(auVar78),ZEXT832(0) << 0x20,4);
                auVar48 = vandps_avx(auVar48,auVar67);
                auVar104._0_4_ = auVar88._0_4_ + auVar84._0_4_;
                auVar104._4_4_ = auVar88._4_4_ + auVar84._4_4_;
                auVar104._8_4_ = auVar88._8_4_ + auVar84._8_4_;
                auVar104._12_4_ = auVar88._12_4_ + auVar84._12_4_;
                auVar104._16_4_ = fVar95 + fVar95;
                auVar104._20_4_ = fVar96 + fVar96;
                auVar104._24_4_ = fVar97 + fVar97;
                auVar104._28_4_ = fStack_1264 + fStack_1264;
                auVar67 = vcmpps_avx(auVar104,local_1320,2);
                auVar48 = vandps_avx(auVar48,auVar67);
                auVar67 = local_14e0 & auVar48;
                if ((((((((auVar67 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar67 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar67 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar67 >> 0x7f,0) != '\0') ||
                      (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar67 >> 0xbf,0) != '\0') ||
                    (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar67[0x1f] < '\0') {
                  auVar48 = vandps_avx(auVar48,local_14e0);
                  auVar25._4_4_ = fVar77 * auVar15._4_4_;
                  auVar25._0_4_ = fVar1 * auVar15._0_4_;
                  auVar25._8_4_ = fVar53 * auVar15._8_4_;
                  auVar25._12_4_ = fVar59 * auVar15._12_4_;
                  auVar25._16_4_ = auVar15._16_4_ * 0.0;
                  auVar25._20_4_ = auVar15._20_4_ * 0.0;
                  auVar25._24_4_ = auVar15._24_4_ * 0.0;
                  auVar25._28_4_ = auVar15._28_4_;
                  auVar75 = vfmadd213ps_fma(auVar70,ZEXT1632(auVar17),auVar25);
                  auVar75 = vfmadd213ps_fma(auVar69,ZEXT1632(auVar79),ZEXT1632(auVar75));
                  local_1340._0_4_ = (float)(uVar35 ^ auVar75._0_4_);
                  local_1340._4_4_ = (float)(uVar92 ^ auVar75._4_4_);
                  local_1340._8_4_ = (float)(uVar93 ^ auVar75._8_4_);
                  local_1340._12_4_ = (float)(uVar94 ^ auVar75._12_4_);
                  local_1340._16_4_ = fVar95;
                  local_1340._20_4_ = fVar96;
                  local_1340._24_4_ = fVar97;
                  local_1340._28_4_ = fStack_1264;
                  fVar61 = (ray->org).field_0.m128[3];
                  fVar52 = local_1320._0_4_;
                  fVar58 = local_1320._4_4_;
                  auVar15._4_4_ = fVar58 * fVar61;
                  auVar15._0_4_ = fVar52 * fVar61;
                  fVar60 = local_1320._8_4_;
                  auVar15._8_4_ = fVar60 * fVar61;
                  fVar62 = local_1320._12_4_;
                  auVar15._12_4_ = fVar62 * fVar61;
                  fVar64 = local_1320._16_4_;
                  auVar15._16_4_ = fVar64 * fVar61;
                  fVar65 = local_1320._20_4_;
                  auVar15._20_4_ = fVar65 * fVar61;
                  fVar66 = local_1320._24_4_;
                  auVar15._24_4_ = fVar66 * fVar61;
                  auVar15._28_4_ = fVar61;
                  auVar67 = vcmpps_avx(auVar15,local_1340,1);
                  fVar61 = ray->tfar;
                  auVar26._4_4_ = fVar58 * fVar61;
                  auVar26._0_4_ = fVar52 * fVar61;
                  auVar26._8_4_ = fVar60 * fVar61;
                  auVar26._12_4_ = fVar62 * fVar61;
                  auVar26._16_4_ = fVar64 * fVar61;
                  auVar26._20_4_ = fVar65 * fVar61;
                  auVar26._24_4_ = fVar66 * fVar61;
                  auVar26._28_4_ = fVar61;
                  auVar54 = vcmpps_avx(local_1340,auVar26,2);
                  auVar67 = vandps_avx(auVar54,auVar67);
                  auVar54 = auVar48 & auVar67;
                  if ((((((((auVar54 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar54 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar54 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar54 >> 0x7f,0) != '\0') ||
                        (auVar54 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar54 >> 0xbf,0) != '\0') ||
                      (auVar54 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar54[0x1f] < '\0') {
                    local_14f0._0_4_ = ray->tfar;
                    local_14f0._4_4_ = ray->mask;
                    local_14f0._8_4_ = ray->id;
                    local_14f0._12_4_ = ray->flags;
                    uVar35 = vextractps_avx(local_14f0,1);
                    local_12e0 = vandps_avx(auVar48,auVar67);
                    auVar48 = vsubps_avx(local_1320,auVar88);
                    local_1380 = vblendvps_avx(auVar84,auVar48,local_1480);
                    auVar48 = vsubps_avx(local_1320,auVar84);
                    local_1360 = vblendvps_avx(auVar88,auVar48,local_1480);
                    local_1260._0_4_ = (float)local_14a0._0_4_ * auVar79._0_4_;
                    local_1260._4_4_ = (float)local_14a0._4_4_ * auVar79._4_4_;
                    local_1260._8_4_ = fStack_1498 * auVar79._8_4_;
                    local_1260._12_4_ = fStack_1494 * auVar79._12_4_;
                    local_1260._16_4_ = fStack_1490 * 0.0;
                    local_1260._20_4_ = fStack_148c * 0.0;
                    local_1260._24_4_ = fStack_1488 * 0.0;
                    local_1260._28_4_ = 0;
                    local_1240._4_4_ = (float)local_14a0._4_4_ * auVar17._4_4_;
                    local_1240._0_4_ = (float)local_14a0._0_4_ * auVar17._0_4_;
                    local_1240._8_4_ = fStack_1498 * auVar17._8_4_;
                    local_1240._12_4_ = fStack_1494 * auVar17._12_4_;
                    local_1240._16_4_ = fStack_1490 * 0.0;
                    local_1240._20_4_ = fStack_148c * 0.0;
                    local_1240._24_4_ = fStack_1488 * 0.0;
                    local_1240._28_4_ = 0;
                    local_1220._4_4_ = (float)local_14a0._4_4_ * fVar77;
                    local_1220._0_4_ = (float)local_14a0._0_4_ * fVar1;
                    local_1220._8_4_ = fStack_1498 * fVar53;
                    local_1220._12_4_ = fStack_1494 * fVar59;
                    local_1220._16_4_ = fStack_1490 * 0.0;
                    local_1220._20_4_ = fStack_148c * 0.0;
                    local_1220._24_4_ = fStack_1488 * 0.0;
                    local_1220._28_4_ = 0;
                    if ((local_15f8->mask & uVar35) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (local_15f8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_004d70f7:
                        ray->tfar = -INFINITY;
                        return;
                      }
                      local_15f0 = context->args;
                      auVar51._0_8_ = (ulong)CONCAT24(uVar9,(uint)uVar9) & 0x7fff00007fff;
                      auVar51._8_4_ = uVar38;
                      auVar51._12_4_ = uVar38;
                      auVar51._16_4_ = uVar38;
                      auVar51._20_4_ = uVar38;
                      auVar51._24_4_ = uVar38;
                      auVar51._28_4_ = uVar38;
                      auVar48 = vpaddd_avx2(auVar51,_DAT_01fec4a0);
                      auVar71._0_8_ = (ulong)CONCAT24(uVar10,(uint)uVar10) & 0x7fff00007fff;
                      auVar71._8_4_ = uVar39;
                      auVar71._12_4_ = uVar39;
                      auVar71._16_4_ = uVar39;
                      auVar71._20_4_ = uVar39;
                      auVar71._24_4_ = uVar39;
                      auVar71._28_4_ = uVar39;
                      auVar67 = vpaddd_avx2(auVar71,_DAT_01fec4c0);
                      auVar81._0_4_ = (float)(int)(*(ushort *)(lVar34 + 8 + lVar28) - 1);
                      auVar81._4_12_ = auVar114._4_12_;
                      auVar75 = vrcpss_avx(auVar81,auVar81);
                      auVar90._0_4_ = (float)(int)(*(ushort *)(lVar34 + 10 + lVar28) - 1);
                      auVar90._4_12_ = auVar114._4_12_;
                      auVar14 = vfnmadd213ss_fma(auVar81,auVar75,SUB6416(ZEXT464(0x40000000),0));
                      fVar1 = auVar75._0_4_ * auVar14._0_4_;
                      auVar75 = vrcpss_avx(auVar90,auVar90);
                      auVar14 = vfnmadd213ss_fma(auVar90,auVar75,SUB6416(ZEXT464(0x40000000),0));
                      fVar77 = auVar75._0_4_ * auVar14._0_4_;
                      auVar48 = vcvtdq2ps_avx(auVar48);
                      fStack_12a4 = auVar48._28_4_ + local_1380._28_4_;
                      auVar67 = vcvtdq2ps_avx(auVar67);
                      auVar54 = vrcpps_avx(local_1320);
                      auVar85._8_4_ = 0x3f800000;
                      auVar85._0_8_ = 0x3f8000003f800000;
                      auVar85._12_4_ = 0x3f800000;
                      auVar85._16_4_ = 0x3f800000;
                      auVar85._20_4_ = 0x3f800000;
                      auVar85._24_4_ = 0x3f800000;
                      auVar85._28_4_ = 0x3f800000;
                      auVar75 = vfnmadd213ps_fma(local_1320,auVar54,auVar85);
                      auVar75 = vfmadd132ps_fma(ZEXT1632(auVar75),auVar54,auVar54);
                      fVar53 = auVar75._0_4_;
                      fVar59 = auVar75._4_4_;
                      fVar61 = auVar75._8_4_;
                      fVar63 = auVar75._12_4_;
                      local_1280[0] = fVar53 * local_1340._0_4_;
                      local_1280[1] = fVar59 * local_1340._4_4_;
                      local_1280[2] = fVar61 * local_1340._8_4_;
                      local_1280[3] = fVar63 * local_1340._12_4_;
                      fStack_1270 = fVar95 * 0.0;
                      fStack_126c = fVar96 * 0.0;
                      fStack_1268 = fVar97 * 0.0;
                      local_12c0[0] = (fVar52 * auVar48._0_4_ + local_1380._0_4_) * fVar1 * fVar53;
                      local_12c0[1] = (fVar58 * auVar48._4_4_ + local_1380._4_4_) * fVar1 * fVar59;
                      local_12c0[2] = (fVar60 * auVar48._8_4_ + local_1380._8_4_) * fVar1 * fVar61;
                      local_12c0[3] = (fVar62 * auVar48._12_4_ + local_1380._12_4_) * fVar1 * fVar63
                      ;
                      fStack_12b0 = (fVar64 * auVar48._16_4_ + local_1380._16_4_) * fVar1 * 0.0;
                      fStack_12ac = (fVar65 * auVar48._20_4_ + local_1380._20_4_) * fVar1 * 0.0;
                      fStack_12a8 = (fVar66 * auVar48._24_4_ + local_1380._24_4_) * fVar1 * 0.0;
                      local_12a0[0] = (fVar52 * auVar67._0_4_ + local_1360._0_4_) * fVar77 * fVar53;
                      local_12a0[1] = (fVar58 * auVar67._4_4_ + local_1360._4_4_) * fVar77 * fVar59;
                      local_12a0[2] = (fVar60 * auVar67._8_4_ + local_1360._8_4_) * fVar77 * fVar61;
                      local_12a0[3] =
                           (fVar62 * auVar67._12_4_ + local_1360._12_4_) * fVar77 * fVar63;
                      fStack_1290 = (fVar64 * auVar67._16_4_ + local_1360._16_4_) * fVar77 * 0.0;
                      fStack_128c = (fVar65 * auVar67._20_4_ + local_1360._20_4_) * fVar77 * 0.0;
                      fStack_1288 = (fVar66 * auVar67._24_4_ + local_1360._24_4_) * fVar77 * 0.0;
                      fStack_1284 = fStack_12a4;
                      uVar35 = vmovmskps_avx(local_12e0);
                      if (uVar35 != 0) {
                        uVar37 = 0;
                        local_1620 = (ulong)(uVar35 & 0xff);
                        for (uVar40 = local_1620; (uVar40 & 1) == 0;
                            uVar40 = uVar40 >> 1 | 0x8000000000000000) {
                          uVar37 = uVar37 + 1;
                        }
                        pRVar13 = context->user;
                        local_14c0 = auVar114._0_32_;
                        do {
                          local_1544 = local_12c0[uVar37];
                          local_1540 = local_12a0[uVar37];
                          ray->tfar = local_1280[uVar37];
                          local_1550 = *(undefined4 *)(local_1260 + uVar37 * 4);
                          local_154c = *(undefined4 *)(local_1240 + uVar37 * 4);
                          local_1548 = *(undefined4 *)(local_1220 + uVar37 * 4);
                          local_1534 = pRVar13->instID[0];
                          local_1530 = pRVar13->instPrimID[0];
                          local_15fc = -1;
                          local_1520.valid = &local_15fc;
                          local_1520.geometryUserPtr = local_15f8->userPtr;
                          local_1520.hit = (RTCHitN *)&local_1550;
                          local_1520.N = 1;
                          local_153c = uVar76;
                          local_1538 = uVar31;
                          local_1520.context = pRVar13;
                          local_1520.ray = (RTCRayN *)ray;
                          if (((local_15f8->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                              ((*local_15f8->occlusionFilterN)(&local_1520), *local_1520.valid != 0)
                              ) && ((local_15f0->filter == (RTCFilterFunctionN)0x0 ||
                                    ((((local_15f0->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                                       RTC_RAY_QUERY_FLAG_INCOHERENT &&
                                      (((local_15f8->field_8).field_0x2 & 0x40) == 0)) ||
                                     ((*local_15f0->filter)(&local_1520), *local_1520.valid != 0))))
                                   )) goto LAB_004d70f7;
                          ray->tfar = (float)local_14f0._0_4_;
                          uVar40 = uVar37 & 0x3f;
                          uVar37 = 0;
                          local_1620 = local_1620 ^ 1L << uVar40;
                          for (uVar40 = local_1620; (uVar40 & 1) == 0;
                              uVar40 = uVar40 >> 1 | 0x8000000000000000) {
                            uVar37 = uVar37 + 1;
                          }
                          auVar114 = ZEXT3264(local_14c0);
                        } while (local_1620 != 0);
                      }
                    }
                  }
                }
                uVar46 = uVar46 - 1 & uVar46;
              } while (uVar46 != 0);
            }
            local_1578 = local_1578 + 1;
            auVar89 = ZEXT3264(local_13a0);
            auVar91 = ZEXT3264(local_13c0);
            auVar101 = ZEXT3264(local_13e0);
            auVar105 = ZEXT3264(local_1400);
            auVar107 = ZEXT3264(local_1420);
            auVar110 = ZEXT3264(local_1440);
            auVar113 = ZEXT3264(local_1460);
          } while (local_1578 != local_1580);
        }
        uVar46 = local_15d8;
        uVar37 = local_15c0;
        uVar40 = local_15c8;
        uVar41 = local_15d0;
        uVar42 = local_15e8;
        uVar45 = local_15e0;
      } while (local_15b8 != &local_1200);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }